

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void get_unshared_pnodes(Parser *p,PNode *x,PNode *y,VecPNode *pvx,VecPNode *pvy)

{
  uint32 *puVar1;
  uint uVar2;
  PNode **ppPVar3;
  PNode **ppPVar4;
  VecPNode *v;
  VecPNode *v_00;
  int iVar5;
  PNode *pPVar6;
  PNode *pPVar7;
  PNode *pPVar8;
  PNode *pn;
  PNode *_t;
  PNode *_t_1;
  ulong uVar9;
  bool bVar10;
  VecPNode sx;
  VecPNode hy;
  VecPNode hx;
  VecPNode local_e0;
  VecPNode local_b8;
  VecPNode *local_90;
  VecPNode *local_88;
  VecPNode local_80;
  VecPNode local_58;
  
  local_58.n = 0;
  local_58.v = (PNode **)0x0;
  local_80.n = 0;
  local_80.v = (PNode **)0x0;
  local_e0.n = 0;
  local_e0.v = (PNode **)0x0;
  local_b8.n = 0;
  local_b8.v = (PNode **)0x0;
  pPVar6 = x->latest;
  pPVar7 = pPVar6->latest;
  pPVar8 = pPVar6;
  local_88 = pvy;
  if (pPVar6 != pPVar6->latest) {
    do {
      pPVar6 = pPVar7;
      pPVar6->refcount = pPVar6->refcount + 1;
      puVar1 = &pPVar8->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_PNode(p,pPVar8);
      }
      x->latest = pPVar6;
      pPVar7 = pPVar6->latest;
      pPVar8 = pPVar6;
    } while (pPVar6 != pPVar6->latest);
  }
  pPVar7 = y->latest;
  pPVar8 = pPVar7->latest;
  pn = pPVar7;
  local_90 = pvx;
  if (pPVar7 != pPVar7->latest) {
    do {
      pPVar7 = pPVar8;
      pPVar7->refcount = pPVar7->refcount + 1;
      puVar1 = &pn->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_PNode(p,pn);
      }
      y->latest = pPVar7;
      pPVar8 = pPVar7->latest;
      pn = pPVar7;
    } while (pPVar7 != pPVar7->latest);
  }
  set_add(&local_e0,pPVar6);
  set_add(&local_b8,pPVar7);
  bVar10 = true;
  do {
    if ((bVar10) && ((pPVar6 == (PNode *)0x0 || (pPVar6->height <= pPVar7->height)))) {
      get_children(p,pPVar7,&local_b8,&local_e0,&local_80);
      pPVar7 = heap_pop(&local_80);
    }
    else {
      get_children(p,pPVar6,&local_e0,&local_b8,&local_58);
      pPVar6 = heap_pop(&local_58);
    }
    v_00 = local_88;
    v = local_90;
    bVar10 = pPVar7 != (PNode *)0x0;
  } while (pPVar6 != (PNode *)0x0 || pPVar7 != (PNode *)0x0);
  if (local_e0.n != 0) {
    ppPVar4 = local_90->e;
    uVar9 = 0;
    do {
      if ((local_e0.v[uVar9] != (PNode *)0x0) &&
         (iVar5 = set_find(&local_b8,local_e0.v[uVar9]), iVar5 == 0)) {
        ppPVar3 = v->v;
        if (ppPVar3 == (PNode **)0x0) {
          pPVar6 = local_e0.v[uVar9];
          v->v = ppPVar4;
          uVar2 = v->n;
          v->n = uVar2 + 1;
          v->e[uVar2] = pPVar6;
        }
        else {
          uVar2 = v->n;
          if (ppPVar3 == ppPVar4) {
            if (2 < uVar2) goto LAB_001444a5;
            pPVar6 = local_e0.v[uVar9];
          }
          else {
            if ((uVar2 & 7) == 0) {
LAB_001444a5:
              vec_add_internal(v,local_e0.v[uVar9]);
              goto LAB_00144437;
            }
            pPVar6 = local_e0.v[uVar9];
          }
          v->n = uVar2 + 1;
          ppPVar3[uVar2] = pPVar6;
        }
      }
LAB_00144437:
      uVar9 = uVar9 + 1;
    } while (uVar9 < local_e0.n);
  }
  if (local_b8.n != 0) {
    uVar9 = 0;
    do {
      if ((local_b8.v[uVar9] != (PNode *)0x0) &&
         (iVar5 = set_find(&local_e0,local_b8.v[uVar9]), iVar5 == 0)) {
        ppPVar4 = v_00->v;
        if (ppPVar4 == (PNode **)0x0) {
          pPVar6 = local_b8.v[uVar9];
          v_00->v = v_00->e;
          uVar2 = v_00->n;
          v_00->n = uVar2 + 1;
          v_00->e[uVar2] = pPVar6;
        }
        else {
          uVar2 = v_00->n;
          if (ppPVar4 == v_00->e) {
            if (2 < uVar2) goto LAB_0014455d;
            pPVar6 = local_b8.v[uVar9];
          }
          else {
            if ((uVar2 & 7) == 0) {
LAB_0014455d:
              vec_add_internal(v_00,local_b8.v[uVar9]);
              goto LAB_001444ed;
            }
            pPVar6 = local_b8.v[uVar9];
          }
          v_00->n = uVar2 + 1;
          ppPVar4[uVar2] = pPVar6;
        }
      }
LAB_001444ed:
      uVar9 = uVar9 + 1;
    } while (uVar9 < local_b8.n);
  }
  if (local_58.v != local_58.e && local_58.v != (PNode **)0x0) {
    free(local_58.v);
  }
  local_58.n = 0;
  local_58.v = (PNode **)0x0;
  if (local_80.v != local_80.e && local_80.v != (PNode **)0x0) {
    free(local_80.v);
  }
  local_80.n = 0;
  local_80.v = (PNode **)0x0;
  if (local_e0.v != local_e0.e && local_e0.v != (PNode **)0x0) {
    free(local_e0.v);
  }
  local_e0.n = 0;
  local_e0.v = (PNode **)0x0;
  if (local_b8.v != local_b8.e && local_b8.v != (PNode **)0x0) {
    free(local_b8.v);
  }
  return;
}

Assistant:

static void get_unshared_pnodes(Parser *p, PNode *x, PNode *y, VecPNode *pvx, VecPNode *pvy) {
  uint i;
  VecPNode hx, hy, sx, sy;
  vec_clear(&hx);
  vec_clear(&hy);
  vec_clear(&sx);
  vec_clear(&sy);
  LATEST(p, x);
  LATEST(p, y);
  set_add(&sx, x);
  set_add(&sy, y);
  while (1) {
    if (!x && !y) break;
    if (!y || (x && x->height > y->height)) {
      get_children(p, x, &sx, &sy, &hx);
      x = heap_pop(&hx);
    } else {
      get_children(p, y, &sy, &sx, &hy);
      y = heap_pop(&hy);
    }
  }
  for (i = 0; i < sx.n; i++)
    if (sx.v[i] && !set_find(&sy, sx.v[i])) vec_add(pvx, sx.v[i]);
  for (i = 0; i < sy.n; i++)
    if (sy.v[i] && !set_find(&sx, sy.v[i])) vec_add(pvy, sy.v[i]);
  vec_free(&hx);
  vec_free(&hy);
  vec_free(&sx);
  vec_free(&sy);
}